

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::TableType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
          *values,TableType *out,char *desc)

{
  TableType *this_00;
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  const_reference pvVar4;
  int __c;
  Var *var_00;
  TableType local_a0;
  Var local_80;
  char *local_38;
  char *desc_local;
  TableType *out_local;
  vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
  *values_local;
  Var *var_local;
  SharedValidator *this_local;
  Result result;
  
  local_38 = desc;
  desc_local = (char *)out;
  out_local = (TableType *)values;
  values_local = (vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                  *)var;
  var_local = (Var *)this;
  Var::Var(&local_80,var);
  sVar2 = std::
          vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
          ::size((vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                  *)out_local);
  var_00 = &local_80;
  this_local._4_4_ = CheckIndex(this,var_00,(Index)sVar2,local_38);
  Var::~Var(&local_80);
  if (desc_local != (char *)0x0) {
    bVar1 = Succeeded(this_local._4_4_);
    this_00 = out_local;
    if (bVar1) {
      pcVar3 = Var::index(var,(char *)var_00,__c);
      pvVar4 = std::
               vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
               ::operator[]((vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                             *)this_00,(ulong)pcVar3 & 0xffffffff);
      local_a0.element = pvVar4->element;
      local_a0.limits.initial = (pvVar4->limits).initial;
      local_a0.limits.max = (pvVar4->limits).max;
      local_a0.limits.has_max = (pvVar4->limits).has_max;
      local_a0.limits.is_shared = (pvVar4->limits).is_shared;
      local_a0.limits.is_64 = (pvVar4->limits).is_64;
      local_a0.limits._19_5_ = *(undefined5 *)&(pvVar4->limits).field_0x13;
    }
    else {
      memset(&local_a0,0,0x20);
      TableType::TableType(&local_a0);
    }
    *(Type *)desc_local = local_a0.element;
    *(uint64_t *)(desc_local + 8) = local_a0.limits.initial;
    *(uint64_t *)(desc_local + 0x10) = local_a0.limits.max;
    desc_local[0x18] = local_a0.limits.has_max;
    desc_local[0x19] = local_a0.limits.is_shared;
    desc_local[0x1a] = local_a0.limits.is_64;
    desc_local[0x1b] = local_a0.limits._19_1_;
    desc_local[0x1c] = local_a0.limits._20_1_;
    desc_local[0x1d] = local_a0.limits._21_1_;
    desc_local[0x1e] = local_a0.limits._22_1_;
    desc_local[0x1f] = local_a0.limits._23_1_;
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}